

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  domain_error *this;
  istream local_2a0 [8];
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  undefined1 local_58 [8];
  string line;
  
  std::ifstream::ifstream(local_2a0,(_filename->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_58 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    line.field_2._8_8_ = &config->testsOrTags;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_2a0,(string *)local_58);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      trim(&local_78,(string *)local_58);
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (line._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"#",(allocator<char> *)&local_98);
        bVar2 = startsWith((string *)local_58,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        if (!bVar2) {
          std::operator+(&local_98,"\"",(string *)local_58);
          std::operator+(&local_78,&local_98,"\",");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)line.field_2._8_8_,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_58);
    std::ifstream::~ifstream(local_2a0);
    return;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 "Unable to load input file: ",_filename);
  std::domain_error::domain_error(this,(string *)local_58);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) )
                addTestOrTags( config, "\"" + line + "\"," );
        }
    }